

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdLegacyPrefixChecks(INSTRUX *Instrux)

{
  byte local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  INSTRUX *Instrux_local;
  
  if (((*(uint *)&Instrux->field_0x5 >> 7 & 1) != 0) &&
     (((Instrux->Attributes & 0x1000) == 0 ||
      (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x1)))) {
    if ((((Instrux->ValidPrefixes).Raw >> 2 & 1) == 0) ||
       ((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) !=
        (undefined1  [32])0x2)) {
      return 0x8000000a;
    }
    *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xfffb | 4;
  }
  if (Instrux->Rep != '\0') {
    if ((Instrux->Attributes & 0x100000000) != 0) {
      return 0x80000002;
    }
    *(ushort *)&Instrux->field_0x9 =
         *(ushort *)&Instrux->field_0x9 & 0xfff7 |
         (ushort)(((Instrux->ValidPrefixes).Raw & 1) != 0) << 3;
    *(ushort *)&Instrux->field_0x9 =
         *(ushort *)&Instrux->field_0x9 & 0xffef |
         (ushort)(((Instrux->ValidPrefixes).Raw >> 1 & 1) != 0) << 4;
    local_19 = false;
    if (((Instrux->ValidPrefixes).Raw >> 6 & 1) != 0) {
      local_19 = Instrux->Rep == 0xf2;
    }
    *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xfeff | (ushort)local_19 << 8
    ;
    local_1a = true;
    if ((*(ushort *)&Instrux->field_0x9 >> 3 & 1) == 0) {
      local_1a = (*(ushort *)&Instrux->field_0x9 >> 4 & 1) != 0;
    }
    *(ushort *)&Instrux->field_0x9 =
         *(ushort *)&Instrux->field_0x9 & 0xfbff | (ushort)local_1a << 10;
    if ((((*(ushort *)&Instrux->field_0x9 >> 2 & 1) != 0) ||
        (((Instrux->ValidPrefixes).Raw >> 8 & 1) != 0)) &&
       ((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) ==
        (undefined1  [32])0x2)) {
      if (((((Instrux->ValidPrefixes).Raw >> 4 & 1) == 0) &&
          (((Instrux->ValidPrefixes).Raw >> 3 & 1) == 0)) || (Instrux->Rep != 0xf2)) {
        if (((((Instrux->ValidPrefixes).Raw >> 5 & 1) != 0) ||
            (((Instrux->ValidPrefixes).Raw >> 3 & 1) != 0)) && (Instrux->Rep == 0xf3)) {
          *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xffbf | 0x40;
        }
      }
      else {
        *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xffdf | 0x20;
      }
    }
  }
  if (Instrux->Seg != '\0') {
    local_1b = false;
    if (((Instrux->ValidPrefixes).Raw >> 7 & 1) != 0) {
      local_1c = true;
      if ((Instrux->Seg != '>') && (local_1c = true, Instrux->Seg != '.')) {
        local_1c = Instrux->Seg == 'd';
      }
      local_1b = local_1c;
    }
    *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xff7f | (ushort)local_1b << 7
    ;
    local_1d = false;
    if (((Instrux->ValidPrefixes).Raw >> 9 & 1) != 0) {
      local_1d = Instrux->Seg == '>';
    }
    *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xfdff | (ushort)local_1d << 9
    ;
  }
  if (((*(uint *)&Instrux->field_0x5 >> 5 & 1) == 0) || ((Instrux->Attributes & 0x4000000) == 0)) {
    if (((*(uint *)&Instrux->field_0x5 >> 6 & 1) == 0) || ((Instrux->Attributes & 0x200000000) == 0)
       ) {
      if (((*(uint *)&Instrux->field_0x5 >> 1 & 1) == 0) ||
         ((Instrux->Attributes & 0x80000000) == 0)) {
        local_1e = 0;
        if ((Instrux->Attributes & 0x800000) != 0) {
          local_1e = (*(ushort *)&Instrux->field_0x9 >> 9 & 1) != 0 ^ 0xff;
        }
        *(ushort *)&Instrux->field_0x9 =
             *(ushort *)&Instrux->field_0x9 & 0xf7ff | (ushort)(local_1e & 1) << 0xb;
        Instrux_local._4_4_ = 0;
      }
      else {
        Instrux_local._4_4_ = 0x80000002;
      }
    }
    else {
      Instrux_local._4_4_ = 0x80000002;
    }
  }
  else {
    Instrux_local._4_4_ = 0x80000002;
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdLegacyPrefixChecks(
    INSTRUX *Instrux
    )
{
    // These checks only apply to legacy encoded instructions.

    // Check for LOCK. LOCK can be present only in two cases:
    // 1. For certain RMW instructions, as long as the destination operand is memory
    // 2. For MOV to/from CR0 in 32-bit mode on AMD CPUs, which allows access to CR8
    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasLock)
    {
        if (0 != (Instrux->Attributes & ND_FLAG_LOCK_SPECIAL) && (ND_CODE_32 == Instrux->DefCode))
        {
            // Special case of LOCK being used by MOV cr to access CR8.
        }
        else if (Instrux->ValidPrefixes.Lock && (Instrux->Operands[0].Type == ND_OP_MEM))
        {
            Instrux->IsLockEnabled = 1;
        }
        else
        {
            return ND_STATUS_BAD_LOCK_PREFIX;
        }
    }

    // Chec for REP prefixes. There are multiple uses:
    // 1. REP/REPNZ/REPZ, for string/IO instructions
    // 2. XACQUIRE/XRELEASE, for HLE-enabled instructions
    // 3. BND prefix, for branches
    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->Rep != 0)
    {
        if (Instrux->Attributes & ND_FLAG_NOREP)
        {
            return ND_STATUS_INVALID_ENCODING;
        }

        Instrux->IsRepEnabled = Instrux->ValidPrefixes.Rep != 0;

        Instrux->IsRepcEnabled = Instrux->ValidPrefixes.RepCond != 0;

        // Bound enablement.
        Instrux->IsBndEnabled = (Instrux->ValidPrefixes.Bnd != 0) && (Instrux->Rep == ND_PREFIX_G1_BND);

        // Check if the instruction is REPed.
        Instrux->IsRepeated = Instrux->IsRepEnabled || Instrux->IsRepcEnabled;

        // Check if the instruction is XACQUIRE or XRELEASE enabled.
        if ((Instrux->IsLockEnabled || Instrux->ValidPrefixes.HleNoLock) &&
            (Instrux->Operands[0].Type == ND_OP_MEM))
        {
            if ((Instrux->ValidPrefixes.Xacquire || Instrux->ValidPrefixes.Hle) && 
                (Instrux->Rep == ND_PREFIX_G1_XACQUIRE))
            {
                Instrux->IsXacquireEnabled = ND_TRUE;
            }
            else if ((Instrux->ValidPrefixes.Xrelease || Instrux->ValidPrefixes.Hle) && 
                (Instrux->Rep == ND_PREFIX_G1_XRELEASE))
            {
                Instrux->IsXreleaseEnabled = ND_TRUE;
            }
        }
    }

    // Check for segment prefixes. Besides offering segment override when accessing memory:
    // 1. Allow for branch hints to conditional branches
    // 2. Allow for Do Not Track prefix for indirect branches, to inhibit CET-IBT tracking
    // Segment prefixes are allowed with XOP/VEX/EVEX instructions, but they have the legacy meaning (no BHINT or DNT).
    if (Instrux->Seg != 0)
    {
        // Branch hint enablement.
        Instrux->IsBhintEnabled = Instrux->ValidPrefixes.Bhint && (
            (Instrux->Seg == ND_PREFIX_G2_BR_TAKEN) ||
            (Instrux->Seg == ND_PREFIX_G2_BR_NOT_TAKEN) ||
            (Instrux->Seg == ND_PREFIX_G2_BR_ALT));

        // Do-not-track hint enablement.
        Instrux->IsDntEnabled = Instrux->ValidPrefixes.Dnt && (Instrux->Seg == ND_PREFIX_G2_NO_TRACK);
    }

    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasOpSize && (Instrux->Attributes & ND_FLAG_NO66))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // Address size override is allowed with all XOP/VEX/EVEX prefixes.
    if (Instrux->HasAddrSize && (Instrux->Attributes & ND_FLAG_NO67))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasRex2 && (Instrux->Attributes & ND_FLAG_NOREX2))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // Check if the instruction is CET tracked. The do not track prefix (0x3E) works only for indirect near JMP and CALL
    // instructions. It is always enabled for far JMP and CALL instructions.
    Instrux->IsCetTracked = ND_HAS_CETT(Instrux) && !Instrux->IsDntEnabled;

    return ND_STATUS_SUCCESS;
}